

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

void xcb_input_string_feedback_ctl_next(xcb_input_string_feedback_ctl_iterator_t *i)

{
  ushort uVar1;
  xcb_input_string_feedback_ctl_t *pxVar2;
  xcb_input_string_feedback_ctl_t *_aux;
  
  pxVar2 = i->data;
  uVar1 = pxVar2->num_keysyms;
  i->index = (int)(xcb_input_string_feedback_ctl_t *)(pxVar2[1].pad0 + (ulong)uVar1 * 4 + -4) -
             (int)pxVar2;
  i->rem = i->rem + -1;
  i->data = (xcb_input_string_feedback_ctl_t *)(pxVar2[1].pad0 + (ulong)uVar1 * 4 + -4);
  return;
}

Assistant:

void
xcb_input_string_feedback_ctl_next (xcb_input_string_feedback_ctl_iterator_t *i)
{
    xcb_input_string_feedback_ctl_t *R = i->data;
    xcb_generic_iterator_t child;
    child.data = (xcb_input_string_feedback_ctl_t *)(((char *)R) + xcb_input_string_feedback_ctl_sizeof(R));
    i->index = (char *) child.data - (char *) i->data;
    --i->rem;
    i->data = (xcb_input_string_feedback_ctl_t *) child.data;
}